

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

buffer_ptr<duckdb::TemplatedValidityData<unsigned_long>_>
duckdb::make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
          (unsigned_long *args)

{
  element_type *in_RDI;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sVar1;
  buffer_ptr<duckdb::TemplatedValidityData<unsigned_long>_> bVar2;
  unsigned_long *in_stack_00000018;
  
  sVar1 = make_shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    (in_stack_00000018);
  bVar2.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       sVar1.internal.
       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  bVar2.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (buffer_ptr<duckdb::TemplatedValidityData<unsigned_long>_>)
         bVar2.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

buffer_ptr<T> make_buffer(ARGS &&...args) { // NOLINT: mimic std casing
	return make_shared_ptr<T>(std::forward<ARGS>(args)...);
}